

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O2

void * threadTask(void *arg)

{
  bool bVar1;
  bool bVar2;
  FILE *__stream;
  adt_buf_err_t aVar3;
  int iVar4;
  uint *puVar5;
  rbf_data_t data;
  void *local_40;
  uint local_38;
  
  if (arg == (void *)0x0) {
    return (void *)0x0;
  }
  do {
    iVar4 = sem_wait((sem_t *)((long)arg + 0x10));
    __stream = _stderr;
    if (iVar4 != 0) {
      puVar5 = (uint *)__errno_location();
      fprintf(__stream,"[APX_ALLOCATOR]: failure while waiting for semaphore, errno=%d\n",
              (ulong)*puVar5);
      return (void *)0x0;
    }
    pthread_spin_lock((pthread_spinlock_t *)((long)arg + 8));
    aVar3 = adt_rbfh_remove((adt_rbfh_t *)((long)arg + 0x30),(uint8_t *)&local_40);
    if ((aVar3 == '\0') && (local_40 != (void *)0x0)) {
      bVar2 = true;
      if ((ulong)local_38 < 0x21) {
        soa_free((soa_t *)((long)arg + 0x58),local_40,(ulong)local_38);
        bVar2 = true;
        goto LAB_0012266f;
      }
      bVar1 = true;
    }
    else {
      bVar2 = false;
LAB_0012266f:
      bVar1 = false;
    }
    pthread_spin_unlock((pthread_spinlock_t *)((long)arg + 8));
    if (bVar1) {
      free(local_40);
      if (!bVar2) {
        return (void *)0x0;
      }
    }
    else if (!(bool)(bVar2 & (local_40 != (void *)0x0 || aVar3 != '\0'))) {
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

static THREAD_PROTO(threadTask,arg)
{
   if(arg!=0)
   {

      apx_allocator_t *self;
      uint32_t messages_processed=0;
      self = (apx_allocator_t*) arg;
      for(;;)
      {
#ifdef _MSC_VER
         DWORD result = WaitForSingleObject(self->semaphore, INFINITE);
         if (result == WAIT_OBJECT_0)
#else
         int result = sem_wait(&self->semaphore);
         if (result == 0)
#endif
         {
            bool processing_result;
            messages_processed++;
            processing_result = apx_allocator_processEvent(self);
            if (!processing_result)
            {
               break;
            }
         }
         else
         {
#ifdef _MSC_VER
            DWORD lastError = GetLastError();
            APX_LOG_ERROR("[APX_ALLOCATOR]: failure while waiting for semaphore, lastError=%d", lastError);
#else
            APX_LOG_ERROR("[APX_ALLOCATOR]: failure while waiting for semaphore, errno=%d", errno);
#endif
            break;
         }
      }
      //APX_LOG_DEBUG("[APX_ALLOCATOR]: messages_processed: %u\n", messages_processed);
   }
   THREAD_RETURN(0);
}